

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O1

void __thiscall
t_js_generator::generate_serialize_field
          (t_js_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  pointer pcVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  int iVar4;
  t_type *ttype;
  ostream *poVar5;
  undefined4 extraout_var;
  runtime_error *prVar6;
  t_struct *tstruct;
  char *pcVar7;
  _Alloc_hider _Var8;
  t_base_type *this_00;
  undefined1 auVar9 [12];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ttype = t_type::get_true_type(tfield->type_);
  iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  if ((char)iVar4 != '\0') {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_b0,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",prefix);
    std::operator+(&local_d0,&local_b0,&tfield->name_);
    std::runtime_error::runtime_error(prVar6,(string *)&local_d0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if (((char)iVar4 == '\0') &&
     (iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar4 == '\0')) {
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
    if ((char)iVar4 == '\0') {
      iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
      if (((char)iVar4 == '\0') &&
         (iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype), (char)iVar4 == '\0')) {
        pcVar1 = (prefix->_M_dataplus)._M_p;
        pcVar2 = (tfield->name_)._M_dataplus._M_p;
        iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
        printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s%s\' TYPE \'%s\'\n",pcVar1,pcVar2,
               *(undefined8 *)CONCAT44(extraout_var,iVar4));
        return;
      }
      pcVar1 = (tfield->name_)._M_dataplus._M_p;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar1,pcVar1 + (tfield->name_)._M_string_length);
      if (prefix->_M_string_length != 0) {
        std::operator+(&local_b0,prefix,&tfield->name_);
        std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"output.",7);
      iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
      if ((char)iVar4 == '\0') {
        iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
        if ((char)iVar4 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeI32(",9);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
        }
      }
      else {
        this_00 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
        switch(this_00) {
        case (t_base_type *)0x0:
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_b0,"compiler error: cannot serialize void field in a struct: ",
                         &local_d0);
          std::runtime_error::runtime_error(prVar6,(string *)&local_b0);
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        case (t_base_type *)0x1:
          iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[7])(ttype);
          pcVar7 = "writeString(";
          if ((char)iVar4 != '\0') {
            pcVar7 = "writeBinary(";
          }
          std::__ostream_insert<char,std::char_traits<char>>(out,pcVar7,0xc);
          break;
        case (t_base_type *)0x2:
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeBool(",10);
          break;
        case (t_base_type *)0x3:
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeByte(",10);
          break;
        case (t_base_type *)0x4:
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeI16(",9);
          break;
        case (t_base_type *)0x5:
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeI32(",9);
          break;
        case (t_base_type *)0x6:
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeI64(",9);
          break;
        case (t_base_type *)0x7:
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeDouble(",0xc);
          break;
        default:
          auVar9 = __cxa_allocate_exception(0x10);
          t_base_type::t_base_name_abi_cxx11_(&local_90,this_00,auVar9._8_4_);
          std::operator+(&local_b0,"compiler error: no JS name for base type ",&local_90);
          std::runtime_error::runtime_error(auVar9._0_8_,(string *)&local_b0);
          __cxa_throw(auVar9._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
          ;
        }
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      _Var8._M_p = local_d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
        return;
      }
      goto LAB_0029388d;
    }
    std::operator+(&local_70,prefix,&tfield->name_);
    generate_serialize_container(this,out,ttype,&local_70);
    pbVar3 = &local_70;
  }
  else {
    std::operator+(&local_50,prefix,&tfield->name_);
    generate_serialize_struct(this,out,tstruct,&local_50);
    pbVar3 = &local_50;
  }
  _Var8._M_p = *(pointer *)((pbVar3->field_2)._M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var8._M_p == &pbVar3->field_2) {
    return;
  }
LAB_0029388d:
  operator_delete(_Var8._M_p);
  return;
}

Assistant:

void t_js_generator::generate_serialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = get_true_type(tfield->get_type());

  // Do nothing for void types
  if (type->is_void()) {
    throw std::runtime_error("CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name());
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, prefix + tfield->get_name());
  } else if (type->is_container()) {
    generate_serialize_container(out, type, prefix + tfield->get_name());
  } else if (type->is_base_type() || type->is_enum()) {

    string name = tfield->get_name();

    // Hack for when prefix is defined (always a hash ref)
    if (!prefix.empty())
      name = prefix + tfield->get_name();

    indent(out) << "output.";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw std::runtime_error("compiler error: cannot serialize void field in a struct: " + name);
        break;
      case t_base_type::TYPE_STRING:
        out << (type->is_binary() ? "writeBinary(" : "writeString(") << name << ")";
        break;
      case t_base_type::TYPE_BOOL:
        out << "writeBool(" << name << ")";
        break;
      case t_base_type::TYPE_I8:
        out << "writeByte(" << name << ")";
        break;
      case t_base_type::TYPE_I16:
        out << "writeI16(" << name << ")";
        break;
      case t_base_type::TYPE_I32:
        out << "writeI32(" << name << ")";
        break;
      case t_base_type::TYPE_I64:
        out << "writeI64(" << name << ")";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "writeDouble(" << name << ")";
        break;
      default:
        throw std::runtime_error("compiler error: no JS name for base type " + t_base_type::t_base_name(tbase));
      }
    } else if (type->is_enum()) {
      out << "writeI32(" << name << ")";
    }
    out << ";" << endl;

  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s%s' TYPE '%s'\n",
           prefix.c_str(),
           tfield->get_name().c_str(),
           type->get_name().c_str());
  }
}